

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Symbol * slang::ast::anon_unknown_39::getVirtualInterfaceTarget
                   (Type *type,ASTContext *context,SourceRange range)

{
  SourceRange sourceRange;
  bool bVar1;
  VirtualInterfaceType *pVVar2;
  SourceLocation in_RSI;
  undefined8 in_RDI;
  VirtualInterfaceType *vit;
  Type *in_stack_ffffffffffffffb0;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffffb8;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffd0;
  DiagCode code;
  InstanceSymbol *local_8;
  
  code = SUB84((ulong)in_RDI >> 0x20,0);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffd0,NonProcedural);
  bVar1 = bitmask<slang::ast::ASTFlags>::has(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    sourceRange.endLoc = in_RSI;
    sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffffd0.m_bits;
    ASTContext::addDiag((ASTContext *)CONCAT44(0x4c0007,in_stack_ffffffffffffffc8),code,sourceRange)
    ;
  }
  Type::getCanonicalType(in_stack_ffffffffffffffb0);
  pVVar2 = Symbol::as<slang::ast::VirtualInterfaceType>((Symbol *)0x8e7e80);
  if (pVVar2->modport == (ModportSymbol *)0x0) {
    local_8 = pVVar2->iface;
  }
  else {
    local_8 = (InstanceSymbol *)pVVar2->modport;
  }
  return (Symbol *)local_8;
}

Assistant:

const Symbol* getVirtualInterfaceTarget(const Type& type, const ASTContext& context,
                                        SourceRange range) {
    if (context.flags.has(ASTFlags::NonProcedural))
        context.addDiag(diag::DynamicNotProcedural, range);

    auto& vit = type.getCanonicalType().as<VirtualInterfaceType>();
    if (vit.modport)
        return vit.modport;

    return &vit.iface;
}